

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,TagVar *arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  ulong uVar1;
  bool bVar2;
  pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool> *ppVar3;
  error_type *peVar4;
  unreachable_exception *this;
  value_type *name;
  variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
  *pvVar5;
  int *piVar6;
  __shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  element_type *peVar8;
  unsigned_long *puVar9;
  uint *puVar10;
  byte local_539;
  MatchFailure local_450;
  unexpected_type<Commands::MatchFailure> local_438;
  MatchFailure local_420;
  unexpected_type<Commands::MatchFailure> local_408;
  Arg *local_3f0;
  MatchFailure local_3e8;
  unexpected_type<Commands::MatchFailure> local_3d0;
  MatchFailure local_3b8;
  unexpected_type<Commands::MatchFailure> local_3a0;
  MatchFailure local_380;
  unexpected_type<Commands::MatchFailure> local_368;
  MatchFailure local_350;
  unexpected_type<Commands::MatchFailure> local_338;
  Reason local_31c;
  __shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_318;
  Reason failure;
  shared_ptr<Var> *var;
  Reason local_300;
  unexpected_type<Commands::MatchFailure> local_2f8;
  MatchFailure local_2d8;
  unexpected_type<Commands::MatchFailure> local_2c0;
  MatchFailure local_2a8;
  unexpected_type<Commands::MatchFailure> local_290;
  unsigned_long local_278;
  optional<unsigned_long> local_270;
  undefined1 local_260 [8];
  optional<int32_t> opt_const;
  unexpected_type<Commands::MatchFailure> local_240;
  MatchFailure local_228;
  unexpected_type<Commands::MatchFailure> local_210;
  undefined1 local_1f8 [8];
  optional<shared_ptr<Var>_> opt_varidx;
  basic_string_view<char,_std::char_traits<char>_> *index;
  undefined1 local_1d0 [8];
  optional<size_t> indexing;
  optional<shared_ptr<Var>_> opt_var;
  value_type *token;
  Reason local_190;
  unexpected_type<Commands::MatchFailure> local_188;
  MatchFailure local_170;
  unexpected_type<Commands::MatchFailure> local_158;
  MatchFailure local_140;
  unexpected_type<Commands::MatchFailure> local_128;
  int local_10c;
  MatchFailure local_108;
  unexpected_type<Commands::MatchFailure> local_f0;
  undefined1 local_d8 [8];
  expected<Miss2Identifier,_Miss2Identifier::Error> opt_token;
  optional<std::pair<string_view,_bool>_> var_ident;
  MatchFailure local_70;
  unexpected_type<Commands::MatchFailure> local_58;
  anon_class_1_0_00000001 local_39;
  optional<const_Command_&> oStack_38;
  anon_class_1_0_00000001 var_matches;
  SymTable *symtable_local;
  Arg *arginfo_local;
  TagVar *arg_local;
  shared_ptr<const_SyntaxTree> *hint_local;
  Commands *commands_local;
  
  oStack_38.ref = (Command *)symtable;
  bVar2 = Miss2Identifier::is_identifier(&arg->ident,options);
  if (!bVar2) {
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_70.context,hint);
    local_70.reason = InvalidIdentifier;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_58,&local_70);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_58);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_58);
    Commands::MatchFailure::~MatchFailure(&local_70);
    return __return_storage_ptr__;
  }
  maybe_var_identifier
            ((optional<std::pair<string_view,_bool>_> *)
             ((long)&opt_token.contained.m_value.index.
                     super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                     .storage_.value_._storage.
                     super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
             + 0x10),&arg->ident,arginfo);
  bVar2 = std::experimental::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&opt_token.contained.m_value.index.
                             super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                             .storage_.value_._storage.
                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
                     + 0x10));
  if (!bVar2) goto LAB_002b22fe;
  ppVar3 = std::experimental::
           optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
           ::operator->((optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
                         *)((long)&opt_token.contained.m_value.index.
                                   super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                                   .storage_.value_._storage.
                                   super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
                           + 0x10));
  Miss2Identifier::match
            ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_d8,&ppVar3->first,options);
  bVar2 = nonstd::expected::operator_cast_to_bool((expected *)local_d8);
  if (bVar2) {
    name = nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::operator*
                     ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_d8);
    SymTable::find_var((optional<shared_ptr<Var>_> *)
                       &indexing.super_OptionalBase<unsigned_long>.storage_,
                       (SymTable *)oStack_38.ref,&name->identifier,scope_ptr);
    bVar2 = std::experimental::optional::operator_cast_to_bool
                      ((optional *)&indexing.super_OptionalBase<unsigned_long>.storage_.dummy_);
    if (bVar2) {
      std::experimental::optional<unsigned_long>::optional((optional<unsigned_long> *)local_1d0);
      bVar2 = std::experimental::operator!=(&name->index);
      if (bVar2) {
        pvVar5 = std::experimental::
                 optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*(&name->index);
        bVar2 = is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                          (pvVar5);
        if (bVar2) {
          pvVar5 = std::experimental::
                   optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*(&name->index);
          puVar9 = eggs::variants::
                   get<unsigned_long,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,0ul>
                             (pvVar5);
          std::experimental::optional<unsigned_long>::operator=
                    ((optional<unsigned_long> *)local_1d0,puVar9);
        }
      }
      bVar2 = std::experimental::operator!=(&name->index);
      if (bVar2) {
        pvVar5 = std::experimental::
                 optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*(&name->index);
        bVar2 = is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                          (pvVar5);
        if (bVar2) goto LAB_002b1c6f;
        pvVar5 = std::experimental::
                 optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*(&name->index);
        opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             eggs::variants::
             get<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,1ul>
                       (pvVar5);
        SymTable::find_var((optional<shared_ptr<Var>_> *)local_1f8,(SymTable *)oStack_38.ref,
                           (string_view *)
                           opt_varidx.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                           scope_ptr);
        bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)local_1f8);
        if (bVar2) {
          p_Var7 = (__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::experimental::optional<std::shared_ptr<Var>_>::operator*
                             ((optional<std::shared_ptr<Var>_> *)local_1f8);
          peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          if (peVar8->type == Int) {
            p_Var7 = (__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::experimental::optional<std::shared_ptr<Var>_>::operator*
                               ((optional<std::shared_ptr<Var>_> *)local_1f8);
            peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var7);
            bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)&peVar8->count);
            if (!bVar2) goto LAB_002b1c33;
            std::shared_ptr<const_SyntaxTree>::shared_ptr
                      ((shared_ptr<const_SyntaxTree> *)&opt_const,hint);
            nonstd::make_unexpected<Commands::MatchFailure>(&local_240,(MatchFailure *)&opt_const);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,&local_240);
            nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_240);
            Commands::MatchFailure::~MatchFailure((MatchFailure *)&opt_const);
            local_10c = 1;
          }
          else {
            std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_228.context,hint);
            local_228.reason = VariableIndexNotInt;
            nonstd::make_unexpected<Commands::MatchFailure>(&local_210,&local_228);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,&local_210);
            nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_210);
            Commands::MatchFailure::~MatchFailure(&local_228);
            local_10c = 1;
          }
        }
        else {
          Commands::find_constant_all((Commands *)local_260,(string_view *)commands);
          bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)local_260);
          if (bVar2) {
            piVar6 = std::experimental::optional<int>::operator*((optional<int> *)local_260);
            local_278 = (unsigned_long)*piVar6;
            std::experimental::optional<unsigned_long>::optional(&local_270,&local_278);
            std::experimental::optional<unsigned_long>::operator=
                      ((optional<unsigned_long> *)local_1d0,&local_270);
            if ((options->pedantic & 1U) == 0) {
LAB_002b1c33:
              local_10c = 0;
            }
            else {
              std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_2a8.context,hint);
              local_2a8.reason = VariableIndexIsConstant;
              nonstd::make_unexpected<Commands::MatchFailure>(&local_290,&local_2a8);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,&local_290);
              nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_290);
              Commands::MatchFailure::~MatchFailure(&local_2a8);
              local_10c = 1;
            }
          }
          else {
            std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_2d8.context,hint);
            local_2d8.reason = VariableIndexNotVar;
            nonstd::make_unexpected<Commands::MatchFailure>(&local_2c0,&local_2d8);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,&local_2c0);
            nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_2c0);
            Commands::MatchFailure::~MatchFailure(&local_2d8);
            local_10c = 1;
          }
        }
        std::experimental::optional<std::shared_ptr<Var>_>::~optional
                  ((optional<std::shared_ptr<Var>_> *)local_1f8);
        if (local_10c != 0) goto LAB_002b22a0;
      }
      else {
LAB_002b1c6f:
        bVar2 = std::experimental::operator==(&name->index);
        if (bVar2) {
          p_Var7 = (__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::experimental::optional<std::shared_ptr<Var>_>::operator*
                             ((optional<std::shared_ptr<Var>_> *)
                              &indexing.super_OptionalBase<unsigned_long>.storage_);
          peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          bVar2 = std::experimental::operator!=(&peVar8->count);
          if (bVar2) {
            std::shared_ptr<const_SyntaxTree>::shared_ptr((shared_ptr<const_SyntaxTree> *)&var,hint)
            ;
            local_300 = ExpectedVarIndex;
            nonstd::make_unexpected<Commands::MatchFailure>(&local_2f8,(MatchFailure *)&var);
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,&local_2f8);
            nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_2f8);
            Commands::MatchFailure::~MatchFailure((MatchFailure *)&var);
            local_10c = 1;
            goto LAB_002b22a0;
          }
        }
      }
      p_Stack_318 = (__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    std::experimental::optional<std::shared_ptr<Var>_>::operator*
                              ((optional<std::shared_ptr<Var>_> *)
                               &indexing.super_OptionalBase<unsigned_long>.storage_);
      if ((((*(ushort *)&arginfo->field_0x1 >> 4 & 1) == 0) ||
          (peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(p_Stack_318), (peVar8->global & 1U) == 0)) &&
         (((*(ushort *)&arginfo->field_0x1 >> 5 & 1) == 0 ||
          (peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(p_Stack_318), (peVar8->global & 1U) != 0)))) {
        local_539 = 1;
        if ((*(ushort *)&arginfo->field_0x1 >> 4 & 1) == 0) {
          local_539 = (byte)(*(ushort *)&arginfo->field_0x1 >> 5) & 1;
        }
        local_31c = VariableNotAllowed - local_539;
        std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_350.context,hint);
        local_350.reason = local_31c;
        nonstd::make_unexpected<Commands::MatchFailure>(&local_338,&local_350);
        nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                  (__return_storage_ptr__,&local_338);
        nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_338);
        Commands::MatchFailure::~MatchFailure(&local_350);
        local_10c = 1;
      }
      else {
        bVar2 = match_arg::anon_class_1_0_00000001::operator()
                          (&local_39,(shared_ptr<Var> *)p_Stack_318,arginfo);
        if (bVar2) {
          bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)local_1d0);
          if (bVar2) {
            peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Stack_318);
            bVar2 = std::experimental::operator==(&peVar8->count);
            if (bVar2) {
              std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_3b8.context,hint);
              local_3b8.reason = VariableIsNotArray;
              nonstd::make_unexpected<Commands::MatchFailure>(&local_3a0,&local_3b8);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,&local_3a0);
              nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_3a0);
              Commands::MatchFailure::~MatchFailure(&local_3b8);
              local_10c = 1;
            }
            else {
              puVar9 = std::experimental::optional<unsigned_long>::operator*
                                 ((optional<unsigned_long> *)local_1d0);
              uVar1 = *puVar9;
              peVar8 = std::__shared_ptr_access<Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Stack_318);
              puVar10 = std::experimental::optional<unsigned_int>::operator*(&peVar8->count);
              if (uVar1 < *puVar10) goto LAB_002b219e;
              std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_3e8.context,hint);
              local_3e8.reason = VariableIndexOutOfRange;
              nonstd::make_unexpected<Commands::MatchFailure>(&local_3d0,&local_3e8);
              nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                        (__return_storage_ptr__,&local_3d0);
              nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_3d0);
              Commands::MatchFailure::~MatchFailure(&local_3e8);
              local_10c = 1;
            }
          }
          else {
LAB_002b219e:
            local_3f0 = arginfo;
            nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                      (__return_storage_ptr__,&local_3f0);
            local_10c = 1;
          }
        }
        else {
          std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_380.context,hint);
          local_380.reason = VariableTypeMismatch;
          nonstd::make_unexpected<Commands::MatchFailure>(&local_368,&local_380);
          nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                    (__return_storage_ptr__,&local_368);
          nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_368);
          Commands::MatchFailure::~MatchFailure(&local_380);
          local_10c = 1;
        }
      }
    }
    else {
      ppVar3 = std::experimental::
               optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
               ::operator->((optional<std::pair<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_bool>_>
                             *)((long)&opt_token.contained.m_value.index.
                                       super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                                       .storage_.value_._storage.
                                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
                               + 0x10));
      if ((ppVar3->second & 1U) == 0) {
        local_10c = 0;
      }
      else {
        std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_420.context,hint);
        local_420.reason = ExpectedVar;
        nonstd::make_unexpected<Commands::MatchFailure>(&local_408,&local_420);
        nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                  (__return_storage_ptr__,&local_408);
        nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_408);
        Commands::MatchFailure::~MatchFailure(&local_420);
        local_10c = 1;
      }
    }
LAB_002b22a0:
    std::experimental::optional<std::shared_ptr<Var>_>::~optional
              ((optional<std::shared_ptr<Var>_> *)
               &indexing.super_OptionalBase<unsigned_long>.storage_);
    if (local_10c == 0) {
      local_10c = 0;
    }
  }
  else {
    peVar4 = nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::error
                       ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_d8);
    switch(*peVar4) {
    case InvalidIdentifier:
      std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_108.context,hint);
      local_108.reason = InvalidIdentifier;
      nonstd::make_unexpected<Commands::MatchFailure>(&local_f0,&local_108);
      nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,&local_f0);
      nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_f0);
      Commands::MatchFailure::~MatchFailure(&local_108);
      local_10c = 1;
      break;
    case NestingOfArrays:
      std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_140.context,hint);
      local_140.reason = IdentifierIndexNesting;
      nonstd::make_unexpected<Commands::MatchFailure>(&local_128,&local_140);
      nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,&local_128);
      nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_128);
      Commands::MatchFailure::~MatchFailure(&local_140);
      local_10c = 1;
      break;
    case NegativeIndex:
      std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_170.context,hint);
      local_170.reason = IdentifierIndexNegative;
      nonstd::make_unexpected<Commands::MatchFailure>(&local_158,&local_170);
      nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,&local_158);
      nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_158);
      Commands::MatchFailure::~MatchFailure(&local_170);
      local_10c = 1;
      break;
    case OutOfRange:
      std::shared_ptr<const_SyntaxTree>::shared_ptr((shared_ptr<const_SyntaxTree> *)&token,hint);
      local_190 = IdentifierIndexOutOfRange;
      nonstd::make_unexpected<Commands::MatchFailure>(&local_188,(MatchFailure *)&token);
      nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
                (__return_storage_ptr__,&local_188);
      nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_188);
      Commands::MatchFailure::~MatchFailure((MatchFailure *)&token);
      local_10c = 1;
      break;
    default:
      this = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(309)."
                );
      __cxa_throw(this,&unreachable_exception::typeinfo,
                  unreachable_exception::~unreachable_exception);
    }
  }
  nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::~expected
            ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_d8);
  if (local_10c != 0) {
    return __return_storage_ptr__;
  }
LAB_002b22fe:
  std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_450.context,hint);
  local_450.reason = NoSuchVar;
  nonstd::make_unexpected<Commands::MatchFailure>(&local_438,&local_450);
  nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
            (__return_storage_ptr__,&local_438);
  nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_438);
  Commands::MatchFailure::~MatchFailure(&local_450);
  return __return_storage_ptr__;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      const TagVar& arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    auto var_matches = [](const shared_ptr<Var>& var, const Command::Arg& arginfo) -> bool
    {
        switch(var->type)
        {
            case VarType::Int:
                return (arginfo.type == ArgType::Integer
                     || arginfo.type == ArgType::Constant 
                     || arginfo.type == ArgType::Param 
                     || (arginfo.type == ArgType::String && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel16 && arginfo.allow_pointer));
            case VarType::Float:
                return (arginfo.type == ArgType::Float || arginfo.type == ArgType::Param);
            case VarType::TextLabel:
                return (arginfo.type == ArgType::TextLabel
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            case VarType::TextLabel16:
                return (arginfo.type == ArgType::TextLabel16
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            default:
                Unreachable();
        }
    };

    if(!Miss2Identifier::is_identifier(arg.ident, options))
        return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });

    if(auto var_ident = maybe_var_identifier(arg.ident, arginfo))
    {
        auto opt_token = Miss2Identifier::match(var_ident->first, options);
        if(!opt_token)
        {
            switch(opt_token.error())
            {
                case Miss2Identifier::InvalidIdentifier:return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });
                case Miss2Identifier::NestingOfArrays:  return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNesting });
                case Miss2Identifier::NegativeIndex:    return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNegative });
                case Miss2Identifier::OutOfRange:       return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexOutOfRange });
                default:                                Unreachable();
            }
        }

        auto& token = *opt_token;
        if(auto opt_var = symtable.find_var(token.identifier, scope_ptr))
        {
            optional<size_t> indexing;

            if(token.index != nullopt && is<size_t>(*token.index))
            {
                indexing = get<size_t>(*token.index);
            }
            if(token.index != nullopt && !is<size_t>(*token.index))
            {
                auto& index = get<string_view>(*token.index);
                if(auto opt_varidx = symtable.find_var(index, scope_ptr))
                {
                    if((*opt_varidx)->type != VarType::Int)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotInt });
                    if((*opt_varidx)->count)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsArray });
                }
                else if(auto opt_const = commands.find_constant_all(index))
                {
                    indexing = *opt_const;
                    if(options.pedantic) // TODO pedantic/warning instead of error
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsConstant });
                }
                else
                {
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotVar });
                }
            }
            else if(token.index == nullopt && (*opt_var)->count != nullopt)
            {
                return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVarIndex });
            }

            auto& var = *opt_var;
            if(!(arginfo.allow_global_var && var->global) && !(arginfo.allow_local_var && !var->global))
            {
                auto failure = arginfo.allow_global_var || arginfo.allow_local_var? MatchFailure::VariableKindNotAllowed :
                                                                                    MatchFailure::VariableNotAllowed;
                return make_unexpected(MatchFailure{ hint, failure });
            }

            if(!var_matches(var, arginfo))
                return make_unexpected(MatchFailure{ hint, MatchFailure::VariableTypeMismatch });

            if(indexing)
            {
                if(var->count == nullopt)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIsNotArray });
                else if(*indexing >= *var->count)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexOutOfRange });
            }

            return &arginfo;
        }
        else if(var_ident->second) // var not found, but required to find one?
        {
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVar });
        }
    }

    return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchVar });
}